

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

Message * __thiscall
google::protobuf::internal::GeneratedMessageReflection::MutableMessage
          (GeneratedMessageReflection *this,Message *message,FieldDescriptor *field,
          MessageFactory *factory)

{
  int iVar1;
  ExtensionSet *this_00;
  MessageLite *pMVar2;
  Message **ppMVar3;
  Message **ppMVar4;
  undefined4 extraout_var;
  Message *pMVar5;
  
  if (*(Descriptor **)(field + 0x38) != this->descriptor_) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"MutableMessage","Field does not match message type.");
  }
  if (*(int *)(field + 0x30) == 3) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"MutableMessage",
               "Field is repeated; the method requires a singular field.");
  }
  if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x2c) * 4) != 10) {
    anon_unknown_0::ReportReflectionUsageTypeError
              (this->descriptor_,field,"MutableMessage",CPPTYPE_MESSAGE);
  }
  if (field[0x34] == (FieldDescriptor)0x1) {
    if (factory == (MessageFactory *)0x0) {
      factory = this->message_factory_;
    }
    this_00 = MutableExtensionSet(this,message);
    pMVar2 = ExtensionSet::MutableMessage(this_00,field,factory);
    return (Message *)pMVar2;
  }
  ppMVar3 = MutableField<google::protobuf::Message*>(this,message,field);
  pMVar5 = *ppMVar3;
  if (pMVar5 == (Message *)0x0) {
    ppMVar4 = DefaultRaw<google::protobuf::Message_const*>(this,field);
    iVar1 = (*((*ppMVar4)->super_MessageLite)._vptr_MessageLite[3])();
    pMVar5 = (Message *)CONCAT44(extraout_var,iVar1);
    *ppMVar3 = pMVar5;
  }
  return pMVar5;
}

Assistant:

Message* GeneratedMessageReflection::MutableMessage(
    Message* message, const FieldDescriptor* field,
    MessageFactory* factory) const {
  USAGE_CHECK_ALL(MutableMessage, SINGULAR, MESSAGE);

  if (factory == NULL) factory = message_factory_;

  if (field->is_extension()) {
    return static_cast<Message*>(
        MutableExtensionSet(message)->MutableMessage(field, factory));
  } else {
    Message* result;
    Message** result_holder = MutableField<Message*>(message, field);
    if (*result_holder == NULL) {
      const Message* default_message = DefaultRaw<const Message*>(field);
      *result_holder = default_message->New();
    }
    result = *result_holder;
    return result;
  }
}